

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

Ref<glTF::Accessor>
ExportData(Asset *a,string *meshName,Ref<glTF::Buffer> *buffer,uint count,void *data,Value typeIn,
          Value typeOut,ComponentType compType,bool isIndices)

{
  uint numCompsIn;
  uint numCompsOut;
  Buffer *this;
  ulong uVar1;
  BufferView *pBVar2;
  Accessor *pAVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  vector<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_> *pvVar6;
  vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *pvVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Ref<glTF::BufferView> RVar11;
  Ref<glTF::Accessor> RVar12;
  Ref<glTF::Accessor> acc;
  int local_58;
  string local_50;
  
  if (data == (void *)0x0 || count == 0) {
    pvVar7 = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0;
    uVar9 = 0;
  }
  else {
    numCompsIn = *(uint *)(&DAT_00758b18 + (ulong)typeIn * 0x10);
    numCompsOut = *(uint *)(&DAT_00758b18 + (ulong)typeOut * 0x10);
    uVar5 = glTF::ComponentTypeSize(compType);
    this = (buffer->vector->super__Vector_base<glTF::Buffer_*,_std::allocator<glTF::Buffer_*>_>).
           _M_impl.super__Vector_impl_data._M_start[buffer->index];
    uVar1 = this->byteLength;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar1;
    uVar10 = (ulong)(count * uVar5 * numCompsOut);
    glTF::Buffer::Grow(this,SUB168(auVar4 % ZEXT416(uVar5),0) + uVar10);
    glTF::Asset::FindUniqueID(&local_50,a,meshName,"view");
    RVar11 = glTF::LazyDict<glTF::BufferView>::Create(&a->bufferViews,local_50._M_dataplus._M_p);
    pvVar6 = RVar11.vector;
    uVar8 = RVar11.index;
    local_58 = (int)uVar1;
    std::__cxx11::string::~string((string *)&local_50);
    pBVar2 = (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar8];
    (pBVar2->buffer).index = buffer->index;
    (pBVar2->buffer).vector = buffer->vector;
    (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->byteOffset =
         (ulong)(uint)(SUB164(auVar4 % ZEXT416(uVar5),0) + local_58);
    (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->byteLength = uVar10;
    (pvVar6->super__Vector_base<glTF::BufferView_*,_std::allocator<glTF::BufferView_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar8]->target = isIndices | BufferViewTarget_ARRAY_BUFFER;
    glTF::Asset::FindUniqueID(&local_50,a,meshName,"accessor");
    RVar12 = glTF::LazyDict<glTF::Accessor>::Create(&a->accessors,local_50._M_dataplus._M_p);
    pvVar7 = RVar12.vector;
    uVar9 = RVar12.index;
    std::__cxx11::string::~string((string *)&local_50);
    pAVar3 = (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
             _M_impl.super__Vector_impl_data._M_start[uVar9];
    (pAVar3->bufferView).vector = pvVar6;
    (pAVar3->bufferView).index = uVar8;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->byteOffset = 0;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->byteStride = 0;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->componentType = compType;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->count = count;
    (pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)._M_impl.
    super__Vector_impl_data._M_start[uVar9]->type = typeOut;
    acc._12_4_ = 0;
    acc.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)
                 SUB128(RVar12._0_12_,0);
    acc.index = SUB124(RVar12._0_12_,8);
    SetAccessorRange(compType,acc,data,count,numCompsIn,numCompsOut);
    glTF::Accessor::WriteData
              ((pvVar7->super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar9],(ulong)count,data,
               (ulong)(uVar5 * numCompsIn));
  }
  RVar12.index = uVar9;
  RVar12.vector = pvVar7;
  RVar12._12_4_ = 0;
  return RVar12;
}

Assistant:

inline Ref<Accessor> ExportData(Asset& a, std::string& meshName, Ref<Buffer>& buffer,
    unsigned int count, void* data, AttribType::Value typeIn, AttribType::Value typeOut, ComponentType compType, bool isIndices = false)
{
    if (!count || !data) return Ref<Accessor>();

    unsigned int numCompsIn = AttribType::GetNumComponents(typeIn);
    unsigned int numCompsOut = AttribType::GetNumComponents(typeOut);
    unsigned int bytesPerComp = ComponentTypeSize(compType);

    size_t offset = buffer->byteLength;
    // make sure offset is correctly byte-aligned, as required by spec
    size_t padding = offset % bytesPerComp;
    offset += padding;
    size_t length = count * numCompsOut * bytesPerComp;
    buffer->Grow(length + padding);

    // bufferView
    Ref<BufferView> bv = a.bufferViews.Create(a.FindUniqueID(meshName, "view"));
    bv->buffer = buffer;
    bv->byteOffset = unsigned(offset);
    bv->byteLength = length; //! The target that the WebGL buffer should be bound to.
    bv->target = isIndices ? BufferViewTarget_ELEMENT_ARRAY_BUFFER : BufferViewTarget_ARRAY_BUFFER;

    // accessor
    Ref<Accessor> acc = a.accessors.Create(a.FindUniqueID(meshName, "accessor"));
    acc->bufferView = bv;
    acc->byteOffset = 0;
    acc->byteStride = 0;
    acc->componentType = compType;
    acc->count = count;
    acc->type = typeOut;

    // calculate min and max values
	SetAccessorRange(compType, acc, data, count, numCompsIn, numCompsOut);

    // copy the data
    acc->WriteData(count, data, numCompsIn*bytesPerComp);

    return acc;
}